

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O0

size_type __thiscall
google::
dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
::erase(dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *this,key_type *key)

{
  bool bVar1;
  dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_RDI;
  const_iterator pos;
  dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_ffffffffffffff88;
  dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_ffffffffffffff90;
  pointer in_stack_ffffffffffffff98;
  dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_ffffffffffffffa0;
  iterator local_48;
  dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_30;
  ulong local_8;
  
  find<int>(in_stack_ffffffffffffffa0,&in_stack_ffffffffffffff98->first);
  dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::dense_hashtable_const_iterator(&local_30,&local_48);
  end(in_RDI);
  dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::dense_hashtable_const_iterator
            ((dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)&stack0xffffffffffffffa0,(iterator *)&stack0xffffffffffffff88);
  bVar1 = dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator!=(&local_30,(const_iterator *)&stack0xffffffffffffffa0);
  if (bVar1) {
    set_deleted(in_stack_ffffffffffffff90,(const_iterator *)in_stack_ffffffffffffff88);
    in_RDI->num_deleted = in_RDI->num_deleted + 1;
    sparsehash_internal::sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>::
    set_consider_shrink((sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4> *)in_RDI,
                        true);
  }
  local_8 = (ulong)bVar1;
  return local_8;
}

Assistant:

size_type erase(const key_type& key) {
    // First, double-check we're not trying to erase delkey or emptyval.
    assert(
        (!settings.use_empty() || !equals(key, key_info.empty_key)) &&
        "Erasing the empty key");
    assert((!settings.use_deleted() || !equals(key, key_info.delkey)) &&
           "Erasing the deleted key");
    const_iterator pos = find(key);  // shrug: shouldn't need to be const
    if (pos != end()) {
      assert(!test_deleted(pos));  // or find() shouldn't have returned it
      set_deleted(pos);
      ++num_deleted;
      settings.set_consider_shrink(
          true);  // will think about shrink after next insert
      return 1;   // because we deleted one thing
    } else {
      return 0;  // because we deleted nothing
    }
  }